

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O0

JsonLexer * __thiscall json::JsonLexer::readFraction_abi_cxx11_(JsonLexer *this,istream *input)

{
  byte bVar1;
  int iVar2;
  long *plVar3;
  runtime_error *this_00;
  JsonLexer local_50 [35];
  char local_2d;
  char c;
  allocator local_1a;
  undefined1 local_19;
  istream *local_18;
  istream *input_local;
  string *fraction;
  
  local_19 = 0;
  local_18 = input;
  input_local = (istream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,".",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  std::istream::get();
  plVar3 = (long *)std::istream::get((char *)local_18);
  bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if (((bVar1 & 1) == 0) && (iVar2 = isdigit((int)local_2d), iVar2 != 0)) {
    std::__cxx11::string::operator+=((string *)this,local_2d);
    readDigits_abi_cxx11_(local_50,local_18);
    std::__cxx11::string::operator+=((string *)this,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    return this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"After a decimal point there must be at least one digit");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string JsonLexer::readFraction(std::istream &input)
    {
        std::string fraction = ".";
        char c;
        input.get(); // This will return a decimal point.

        if (!(input.get(c)) || !isdigit(c))
            throw std::runtime_error("After a decimal point there must be at least one digit");

        fraction += c;
        fraction += readDigits(input);
        return fraction;
    }